

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O3

void cmime_message_set_message_id(CMimeMessage_T *message,char *mid)

{
  char *value;
  size_t __n;
  ulong uVar1;
  
  if (*mid == '<') {
    value = strdup(mid);
  }
  else {
    __n = strlen(mid);
    value = (char *)malloc(__n + 4);
    *value = '<';
    if (__n == 0) {
      uVar1 = 1;
    }
    else {
      memcpy(value + 1,mid,__n);
      uVar1 = (ulong)((int)__n + 1);
    }
    (value + uVar1)[0] = '>';
    (value + uVar1)[1] = '\0';
  }
  _cmime_internal_set_linked_header_value(message->headers,"Message-ID",value);
  free(value);
  return;
}

Assistant:

void cmime_message_set_message_id(CMimeMessage_T *message, const char *mid) {
    char *id = NULL;
    int i;
    int pos = 0;
    if (mid[0] != '<') {
        id = (char *)malloc(strlen(mid) + 4);
        id[pos++] = '<';
        for (i = 0; i < strlen(mid); i++) {
            id[pos++] = mid[i];
        }
        id[pos++] = '>';
        id[pos++] = '\0';
    } else
        id = strdup(mid);

    _cmime_internal_set_linked_header_value(message->headers,"Message-ID",id);
    free(id);
}